

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O2

bool __thiscall cursespp::ListWindow::ProcessMouseEvent(ListWindow *this,Event *event)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  bVar2 = ScrollableWindow::ProcessMouseEvent(&this->super_ScrollableWindow,event);
  sVar1 = (this->scrollPosition).firstVisibleEntryIndex;
  if (sVar1 != NO_SELECTION) {
    uVar6 = sVar1 + (long)event->y;
    iVar3 = (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
              _vptr_IOrderable[0x42])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var,iVar3));
    if (uVar6 < uVar5) {
      uVar4 = event->state;
      if ((uVar4 & 4) != 0) {
        (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
          _vptr_IOrderable[0x46])(this,uVar6);
        uVar4 = event->state;
      }
      lVar7 = 0x250;
      if ((uVar4 >> 0xc & 1) == 0) {
        if ((uVar4 & 8) == 0) {
          return bVar2;
        }
        Window::FocusInParent((Window *)this);
        lVar7 = 0x248;
      }
      (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
        [0x46])(this,uVar6);
      (**(code **)((long)(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable.
                         _vptr_IOrderable + lVar7))(this,uVar6);
    }
  }
  return bVar2;
}

Assistant:

bool ListWindow::ProcessMouseEvent(const IMouseHandler::Event& event) {
    /* CAL TODO: this method assumes each row is a single cell tall. */
    bool result = ScrollableWindow::ProcessMouseEvent(event);

    auto first = this->scrollPosition.firstVisibleEntryIndex;

    if (first == NO_SELECTION) {
        return result;
    }

    size_t offset = first + (size_t) event.y;

    if (offset < this->GetScrollAdapter().GetEntryCount()) {
        if (event.Button1Clicked()) {
            this->SetSelectedIndex(offset);
        }
        if (event.Button3Clicked()) {
            this->SetSelectedIndex(offset);
            this->OnEntryContextMenu(offset);
        }
        else if (event.Button1DoubleClicked()) {
            this->FocusInParent();
            this->SetSelectedIndex(offset);
            this->OnEntryActivated(offset); /* internal */
        }
    }

    return result;
}